

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall
Handler::DeployVirtualMachine
          (Handler *this,uint16_t *purchasedServerIdx,Request *req,LOCATION *location)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  RequestResult RVar8;
  uint8_t uVar9;
  mapped_type mVar10;
  reference pvVar11;
  reference pvVar12;
  PurchasedServer *this_00;
  Handler *this_01;
  size_type sVar13;
  mapped_type *pmVar14;
  reference pvVar15;
  reference pvVar16;
  int *in_RCX;
  long in_RDX;
  ushort *in_RSI;
  long in_RDI;
  uint16_t memorySize;
  uint16_t cpuCore;
  uint32_t n;
  RequestResult *requestResult;
  DeployedVirtualMachine *deployedVM;
  VirtualMachine *vm;
  uint32_t addIdx;
  int vmId;
  uint16_t vmIdx;
  uint16_t purchasedServerId;
  PurchasedServer *purchasedServer;
  undefined4 in_stack_ffffffffffffff68;
  unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *in_stack_ffffffffffffff70;
  PurchasedServer *purchasedServer_00;
  Handler *this_02;
  
  pvVar11 = std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::operator[]
                      ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                       (in_RDI + 0x669d8),(ulong)*in_RSI);
  uVar1 = pvVar11->id;
  uVar2 = *(ushort *)(in_RDX + 8);
  iVar5 = *(int *)(in_RDX + 0xc);
  uVar6 = *(uint *)(in_RDX + 4);
  pvVar12 = std::vector<VirtualMachine,_std::allocator<VirtualMachine>_>::operator[]
                      ((vector<VirtualMachine,_std::allocator<VirtualMachine>_> *)(in_RDI + 0x48),
                       (ulong)uVar2);
  this_00 = (PurchasedServer *)operator_new(0xc);
  *(undefined4 *)&this_00->remainMemorySizeA = 0;
  this_00->id = 0;
  this_00->serverIdx = '\0';
  this_00->vacancyRate = '\0';
  this_00->remainCpuCoreA = 0;
  this_00->remainCpuCoreB = 0;
  DeployedVirtualMachine::DeployedVirtualMachine((DeployedVirtualMachine *)this_00);
  purchasedServer_00 = this_00;
  this_01 = (Handler *)operator_new(8);
  *(RequestResult *)this_01 = (RequestResult)0x0;
  RequestResult::RequestResult((RequestResult *)this_01);
  this_02 = this_01;
  sVar13 = std::vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_>::size
                     ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)
                      (in_RDI + 0x669f0));
  mVar10 = (mapped_type)sVar13;
  uVar3 = pvVar12->cpuCore;
  uVar4 = pvVar12->memorySize;
  iVar7 = *in_RCX;
  if (iVar7 == 1) {
    pvVar11->remainCpuCoreA = pvVar11->remainCpuCoreA - uVar3;
    pvVar11->remainMemorySizeA = pvVar11->remainMemorySizeA - uVar4;
    *(bool *)&this_00->remainMemorySizeA = true;
    this_01->purchaseMemorySizeParameter = NODE_A;
  }
  else if (iVar7 == 2) {
    pvVar11->remainCpuCoreB = pvVar11->remainCpuCoreB - uVar3;
    pvVar11->remainMemorySizeB = pvVar11->remainMemorySizeB - uVar4;
    *(bool *)&this_00->remainMemorySizeA = false;
    this_01->purchaseMemorySizeParameter = NODE_B;
  }
  else {
    if (iVar7 != 3) {
      return;
    }
    pvVar11->remainCpuCoreA = pvVar11->remainCpuCoreA - (short)((int)(uint)uVar3 >> 1);
    pvVar11->remainCpuCoreB = pvVar11->remainCpuCoreB - (short)((int)(uint)uVar3 >> 1);
    pvVar11->remainMemorySizeA = pvVar11->remainMemorySizeA - (short)((int)(uint)uVar4 >> 1);
    pvVar11->remainMemorySizeB = pvVar11->remainMemorySizeB - (short)((int)(uint)uVar4 >> 1);
    this_01->purchaseMemorySizeParameter = ALL;
  }
  *(int *)(in_RDI + 0x66a0c) = *(int *)(in_RDI + 0x66a0c) + 1;
  pmVar14 = std::
            unordered_map<int,_unsigned_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
            ::operator[](in_stack_ffffffffffffff70,
                         (key_type *)CONCAT44(mVar10,in_stack_ffffffffffffff68));
  *pmVar14 = mVar10;
  std::
  unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>
  ::emplace<unsigned_int&>
            ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)this_02,(uint *)purchasedServer_00);
  uVar9 = CalculateVacancyRate(this_02,purchasedServer_00);
  pvVar11->vacancyRate = uVar9;
  this_00->id = uVar1;
  *(ushort *)&this_00->serverIdx = uVar2;
  this_00->remainCpuCoreA = (short)iVar5;
  this_00->remainCpuCoreB = (short)((uint)iVar5 >> 0x10);
  std::vector<DeployedVirtualMachine,std::allocator<DeployedVirtualMachine>>::
  emplace_back<DeployedVirtualMachine&>
            ((vector<DeployedVirtualMachine,_std::allocator<DeployedVirtualMachine>_> *)this_02,
             (DeployedVirtualMachine *)purchasedServer_00);
  *(uint16_t *)&this_01->purchaseCpuCoreParameter = uVar1;
  pvVar15 = std::vector<Result,_std::allocator<Result>_>::operator[]
                      ((vector<Result,_std::allocator<Result>_> *)(in_RDI + 0x66a18),
                       (ulong)*(ushort *)(in_RDI + 0x66a08));
  pvVar16 = std::vector<RequestResult,_std::allocator<RequestResult>_>::operator[]
                      (&pvVar15->requestResult,(ulong)uVar6);
  RVar8 = *(RequestResult *)this_01;
  pvVar16->purchasedServerId = RVar8.purchasedServerId;
  *(short *)&pvVar16->field_0x2 = RVar8._2_2_;
  pvVar16->location = RVar8.location;
  return;
}

Assistant:

void Handler::DeployVirtualMachine(const uint16_t &purchasedServerIdx, const Request &req, const LOCATION &location) {
    PurchasedServer &purchasedServer = purchasedServers[purchasedServerIdx];
    uint16_t purchasedServerId = purchasedServer.id;
    uint16_t vmIdx = req.vmIdx;
    int vmId = req.vmId;
    uint32_t addIdx = req.addIdx;
    VirtualMachine &vm = virtualMachines[vmIdx];

    auto *deployedVM = new DeployedVirtualMachine();
    auto *requestResult = new RequestResult();
    uint32_t n = deployedVMs.size();
    uint16_t cpuCore = vm.cpuCore;
    uint16_t memorySize = vm.memorySize;

    switch (location) {
        case NODE_A:
            purchasedServer.remainCpuCoreA -= cpuCore;
            purchasedServer.remainMemorySizeA -= memorySize;
            deployedVM->location = true;
            requestResult->location = NODE_A;
            break;
        case NODE_B:
            purchasedServer.remainCpuCoreB -= cpuCore;
            purchasedServer.remainMemorySizeB -= memorySize;
            deployedVM->location = false;
            requestResult->location = NODE_B;
            break;
        case ALL:
            purchasedServer.remainCpuCoreA -= cpuCore >> 1u;
            purchasedServer.remainCpuCoreB -= cpuCore >> 1u;
            purchasedServer.remainMemorySizeA -= memorySize >> 1u;
            purchasedServer.remainMemorySizeB -= memorySize >> 1u;
            requestResult->location = ALL;
            break;
        default:
            return;
    }

    ++deployedVMNum;
    idDeployedVMMap[vmId] = n;
    purchasedServer.deployedVM.emplace(n);
    purchasedServer.vacancyRate = CalculateVacancyRate(purchasedServer);
    deployedVM->purchasedServerId = purchasedServerId;
    deployedVM->vmIdx = vmIdx;
    deployedVM->vmId = vmId;
    deployedVMs.emplace_back(*deployedVM);
    requestResult->purchasedServerId = purchasedServerId;
    result[today].requestResult[addIdx] = *requestResult;
}